

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O1

Var Js::RegexHelper::RegexEs5MatchImpl<false>
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input,bool noResult,void *stackAllocationPointer)

{
  int iVar1;
  RegexPattern *this;
  TrigramAlphabet *this_00;
  char *pcVar2;
  RecyclableObject *nonMatchValue;
  long lVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  uint16 uVar7;
  charcount_t inputLength;
  char16 *input_00;
  GroupInfo GVar8;
  GroupInfo GVar9;
  Var pvVar10;
  undefined4 *puVar11;
  Matcher *pMVar12;
  JavascriptArray *this_01;
  SparseArraySegmentBase *pSVar13;
  JavascriptString *pJVar14;
  JavascriptLibrary *pJVar15;
  long *addr;
  char *addr_00;
  uint32 offset;
  uint uVar16;
  CharCount inputLength_00;
  void *pvVar17;
  charcount_t length;
  ulong uVar18;
  Type *addr_01;
  Type offset_00;
  Type *addr_02;
  ulong uVar19;
  undefined1 local_a0 [8];
  RegexMatchState state;
  ulong local_60;
  JavascriptArray *local_40;
  
  local_60 = 0xffffffff00000000;
  this = (regularExpression->pattern).ptr;
  pvVar17 = stackAllocationPointer;
  input_00 = JavascriptString::GetString(input);
  inputLength_00 = (CharCount)pvVar17;
  inputLength = JavascriptString::GetLength(input);
  RegexHelperTrace(scriptContext,Match,regularExpression,input);
  this_00 = scriptContext->trigramAlphabet;
  pcVar2 = *(char **)((long)&this->rep + 0x10);
  if ((249999 < inputLength && this_00 != (TrigramAlphabet *)0x0) && pcVar2 != (char *)0x0) {
    if (this_00->input == (char16 *)0x0) {
      UnifiedRegex::TrigramAlphabet::MegaMatch(this_00,input_00,inputLength);
    }
    if (*pcVar2 == '\x01') {
      iVar1 = *(int *)(pcVar2 + 0xc);
      if (iVar1 < 1) {
        uVar19 = 0;
        uVar18 = 0xffffffff00000000;
      }
      else {
        uVar19 = (ulong)*(uint *)(pcVar2 + (ulong)(iVar1 - 1) * 4 + 0x10);
        uVar18 = 0x800000000;
      }
      if ((this->rep).unified.program.ptr == (Program *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x1dc,"(pattern->rep.unified.program != 0)",
                                    "pattern->rep.unified.program != 0");
        if (!bVar6) goto LAB_00d51e16;
        *puVar11 = 0;
      }
      addr = (long *)((long)&this->rep + 8);
      if ((this->rep).unified.matcher.ptr == (Matcher *)0x0) {
        pMVar12 = UnifiedRegex::Matcher::New(scriptContext,this);
        Memory::Recycler::WBSetBit((char *)addr);
        (this->rep).unified.matcher.ptr = pMVar12;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      }
      lVar3 = *addr;
      if (*(short *)(*(long *)(lVar3 + 0x10) + 0xc) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/RegexRuntime.h"
                                    ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                                    "groupId >= 0 && groupId < program->numGroups");
        if (!bVar6) goto LAB_00d51e16;
        *puVar11 = 0;
      }
      **(ulong **)(lVar3 + 0x18) = uVar18 | uVar19;
      bVar6 = UnifiedRegex::RegexPattern::IsGlobal(this);
      if (!bVar6) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x1e1,"(pattern->IsGlobal())","pattern->IsGlobal()");
        if (!bVar6) {
LAB_00d51e16:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar11 = 0;
      }
      UnifiedRegex::RegexPattern::NumGroups(this);
      this_01 = JavascriptLibrary::CreateArrayOnStack
                          ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                           stackAllocationPointer);
      if (0 < *(int *)(pcVar2 + 0xc)) {
        if (pcVar2[1] == '\0') {
          if (0 < *(int *)(pcVar2 + 0xc)) {
            addr_00 = pcVar2 + 0x90;
            uVar18 = 0;
            do {
              pJVar14 = SubString::New(input,*(charcount_t *)(pcVar2 + uVar18 * 4 + 0x10),8);
              Memory::Recycler::WBSetBit(addr_00);
              *(JavascriptString **)addr_00 = pJVar14;
              Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
              pSVar13 = JavascriptArray::GetLastUsedSegment(this_01);
              if ((uVar18 < pSVar13->left) ||
                 (uVar16 = (uint32)uVar18 - pSVar13->left, pSVar13->size <= uVar16)) {
                JavascriptArray::DirectSetItem_Full<Js::JavascriptString*>
                          (this_01,(uint32)uVar18,pJVar14);
              }
              else {
                JavascriptArray::DirectSetItemInLastUsedSegmentAt<Js::JavascriptString*>
                          (this_01,uVar16,pJVar14);
              }
              uVar18 = uVar18 + 1;
              addr_00 = addr_00 + 8;
            } while ((long)uVar18 < (long)*(int *)(pcVar2 + 0xc));
          }
          pcVar2[1] = '\x01';
        }
        else if (0 < *(int *)(pcVar2 + 0xc)) {
          uVar18 = 0;
          do {
            pJVar14 = *(JavascriptString **)(pcVar2 + uVar18 * 8 + 0x90);
            pSVar13 = JavascriptArray::GetLastUsedSegment(this_01);
            if ((uVar18 < pSVar13->left) ||
               (uVar16 = (uint32)uVar18 - pSVar13->left, pSVar13->size <= uVar16)) {
              JavascriptArray::DirectSetItem_Full<Js::JavascriptString*>
                        (this_01,(uint32)uVar18,pJVar14);
            }
            else {
              JavascriptArray::DirectSetItemInLastUsedSegmentAt<Js::JavascriptString*>
                        (this_01,uVar16,pJVar14);
            }
            uVar18 = uVar18 + 1;
          } while ((long)uVar18 < (long)*(int *)(pcVar2 + 0xc));
        }
      }
      if (0 < iVar1) {
        return this_01;
      }
      pJVar15 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
      goto LAB_00d51df8;
    }
  }
  bVar6 = UnifiedRegex::RegexPattern::IsGlobal(this);
  bVar5 = UnifiedRegex::RegexPattern::IsSticky(this);
  if (bVar6) {
    offset_00 = 0;
  }
  else {
    offset_00 = 0;
    if (bVar5) {
      if (regularExpression->lastIndexOrFlag == 0xfffffffe) {
        JavascriptRegExp::CacheLastIndex(regularExpression);
      }
      offset_00 = regularExpression->lastIndexOrFlag;
    }
  }
  PrimBeginMatch((RegexMatchState *)local_a0,scriptContext,this,input_00,inputLength_00,false);
  if (inputLength < offset_00) {
LAB_00d5181f:
    local_40 = (JavascriptArray *)0x0;
    uVar18 = 0;
  }
  else {
    pMVar12 = (Matcher *)__tls_get_addr(&PTR_0155fe48);
    GVar9 = PrimMatch((RegexMatchState *)local_a0,scriptContext,this,inputLength,offset_00);
    uVar18 = (ulong)GVar9 >> 0x20;
    uVar19 = 0;
    if (uVar18 == 0xffffffff) goto LAB_00d5181f;
    local_40 = (JavascriptArray *)0x0;
    state.matcher = pMVar12;
    do {
      GVar8 = GVar9;
      length = (charcount_t)uVar18;
      if (!noResult) {
        if (local_40 == (JavascriptArray *)0x0) {
          uVar7 = UnifiedRegex::RegexPattern::NumGroups(this);
          if (bVar6) {
            local_40 = JavascriptLibrary::CreateArrayOnStack
                                 ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                                  stackAllocationPointer);
          }
          else {
            local_40 = JavascriptRegularExpressionResult::Create
                                 (stackAllocationPointer,(uint)uVar7,input,scriptContext);
          }
        }
        pJVar14 = SubString::New(input,GVar8.offset,length);
        uVar16 = (uint)uVar19;
        if (bVar6) {
          if (uVar16 == 0xffffffff) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            pMVar12 = state.matcher;
            *(undefined4 *)&((state.matcher)->pattern).ptr = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.inl"
                                        ,0x1d5,"(itemIndex < InvalidIndex)",
                                        "itemIndex < InvalidIndex");
            if (!bVar5) goto LAB_00d51e16;
            *(undefined4 *)&(pMVar12->pattern).ptr = 0;
          }
          pSVar13 = JavascriptArray::GetLastUsedSegment(local_40);
          offset = uVar16 - pSVar13->left;
          if ((uVar16 < pSVar13->left) || (pSVar13->size <= offset)) {
            JavascriptArray::DirectSetItem_Full<Js::JavascriptString*>(local_40,uVar16,pJVar14);
          }
          else {
            JavascriptArray::DirectSetItemInLastUsedSegmentAt<Js::JavascriptString*>
                      (local_40,offset,pJVar14);
          }
        }
        else {
          if (((local_40->head).ptr)->length <= uVar16) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            pMVar12 = state.matcher;
            *(undefined4 *)&((state.matcher)->pattern).ptr = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                        ,0x22f,"(globalIndex < arrayResult->GetHead()->length)",
                                        "globalIndex < arrayResult->GetHead()->length");
            if (!bVar5) goto LAB_00d51e16;
            *(undefined4 *)&(pMVar12->pattern).ptr = 0;
          }
          addr_02 = &(local_40->head).ptr[1].left + uVar19 * 2;
          Memory::Recycler::WBSetBit((char *)addr_02);
          *(JavascriptString **)addr_02 = pJVar14;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_02);
        }
        uVar19 = (ulong)(uVar16 + 1);
      }
      if ((!bVar6) || (uVar16 = length + GVar8.offset + (uint)(length == 0), inputLength < uVar16))
      break;
      GVar9 = PrimMatch((RegexMatchState *)local_a0,scriptContext,this,inputLength,uVar16);
      uVar18 = (ulong)GVar9 >> 0x20;
    } while (uVar18 != 0xffffffff);
    local_60 = (ulong)GVar8 & 0xffffffff00000000;
    uVar18 = (ulong)GVar8 & 0xffffffff;
  }
  if (state.input != (char16 *)0x0) {
    ScriptContext::ReleaseTemporaryAllocator(scriptContext,(TempArenaAllocatorObject *)state.input);
  }
  if (local_40 != (JavascriptArray *)0x0) {
    uVar7 = UnifiedRegex::RegexPattern::NumGroups(this);
    if (bVar6) {
      return local_40;
    }
    if (1 < uVar7) {
      nonMatchValue =
           (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
      pSVar13 = (local_40->head).ptr;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      addr_01 = (Type *)&pSVar13[1].size;
      uVar19 = 1;
      do {
        pSVar13 = (local_40->head).ptr;
        if (pSVar13->length + pSVar13->left <= uVar19) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                      ,0x24b,
                                      "(groupId < arrayResult->GetHead()->left + arrayResult->GetHead()->length)"
                                      ,
                                      "groupId < arrayResult->GetHead()->left + arrayResult->GetHead()->length"
                                     );
          if (!bVar6) goto LAB_00d51e16;
          *puVar11 = 0;
        }
        GVar9 = UnifiedRegex::RegexPattern::GetGroup(this,(int)uVar19);
        pvVar10 = GetString(scriptContext,input,nonMatchValue,GVar9);
        Memory::Recycler::WBSetBit((char *)addr_01);
        addr_01->ptr = (SparseArraySegmentBase *)pvVar10;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
        uVar19 = uVar19 + 1;
        addr_01 = addr_01 + 1;
      } while (uVar7 != uVar19);
    }
    JavascriptRegularExpressionResult::SetMatch(local_40,(GroupInfo)(local_60 | uVar18));
    return local_40;
  }
  pJVar15 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
LAB_00d51df8:
  return (pJVar15->super_JavascriptLibraryBase).nullValue.ptr;
}

Assistant:

Var RegexHelper::RegexEs5MatchImpl(ScriptContext* scriptContext, JavascriptRegExp *regularExpression, JavascriptString *input, bool noResult, void *const stackAllocationPointer)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();
        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength();

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Match, regularExpression, input);
#endif

        UnifiedRegex::GroupInfo lastSuccessfulMatch; // initially undefined
        UnifiedRegex::GroupInfo lastActualMatch; // initially undefined

#ifdef REGEX_TRIGRAMS
        UnifiedRegex::TrigramAlphabet* trigramAlphabet = scriptContext->GetTrigramAlphabet();
        UnifiedRegex::TrigramInfo* trigramInfo = pattern->rep.unified.trigramInfo;
        if (trigramAlphabet != NULL && inputLength >= MinTrigramInputLength && trigramInfo != NULL)
        {
            if (trigramAlphabet->input == NULL)
            {
                trigramAlphabet->MegaMatch((char16*)inputStr, inputLength);
            }
            if (trigramInfo->isTrigramPattern)
            {
                if (trigramInfo->resultCount > 0)
                {
                    lastSuccessfulMatch.offset = trigramInfo->offsets[trigramInfo->resultCount - 1];
                    lastSuccessfulMatch.length = UnifiedRegex::TrigramInfo::PatternLength;
                }
                // else: leave lastMatch undefined

                // Make sure a matcher is allocated and holds valid last match in case the RegExp constructor
                // needs to fill-in details from the last match via JavascriptRegExpConstructor::EnsureValues
                Assert(pattern->rep.unified.program != 0);
                if (pattern->rep.unified.matcher == 0)
                    pattern->rep.unified.matcher = UnifiedRegex::Matcher::New(scriptContext, pattern);
                *pattern->rep.unified.matcher->GroupIdToGroupInfo(0) = lastSuccessfulMatch;

                Assert(pattern->IsGlobal());

                JavascriptArray* arrayResult = CreateMatchResult(stackAllocationPointer, scriptContext, /* isGlobal */ true, pattern->NumGroups(), input);
                FinalizeMatchResult(scriptContext, /* isGlobal */ true, arrayResult, lastSuccessfulMatch);

                if (trigramInfo->resultCount > 0)
                {
                    if (trigramInfo->hasCachedResultString)
                    {
                        for (int k = 0; k < trigramInfo->resultCount; k++)
                        {
                            arrayResult->DirectSetItemAt(k,
                                static_cast<Js::JavascriptString*>(trigramInfo->cachedResult[k]));
                        }
                    }
                    else
                    {
                        for (int k = 0; k < trigramInfo->resultCount; k++)
                        {
                            JavascriptString * str = SubString::New(input, trigramInfo->offsets[k], UnifiedRegex::TrigramInfo::PatternLength);
                            trigramInfo->cachedResult[k] = str;
                            arrayResult->DirectSetItemAt(k, str);
                        }
                        trigramInfo->hasCachedResultString = true;
                    }
                } // otherwise, there are no results and null will be returned

                if (updateHistory)
                {
                    PropagateLastMatch(scriptContext, /* isGlobal */ true, pattern->IsSticky(), regularExpression, input, lastSuccessfulMatch, lastActualMatch, true, true);
                }

                return lastSuccessfulMatch.IsUndefined() ? scriptContext->GetLibrary()->GetNull() : arrayResult;
            }
        }
#endif

        // If global regex, result array holds substrings for each match, and group bindings are ignored
        // If non-global regex, result array holds overall substring and each group binding substring

        const bool isGlobal = pattern->IsGlobal();
        const bool isSticky = pattern->IsSticky();
        JavascriptArray* arrayResult = 0;
        RegexMatchState state;

        // If global = false and sticky = true, set offset = lastIndex, else set offset = 0
        CharCount offset = 0;
        if (!isGlobal && isSticky)
        {
            offset = regularExpression->GetLastIndex();
        }

        uint32 globalIndex = 0;
        PrimBeginMatch(state, scriptContext, pattern, inputStr, inputLength, false);

        do
        {
            if (offset > inputLength)
            {
                lastActualMatch.Reset();
                break;
            }
            lastActualMatch = PrimMatch(state, scriptContext, pattern, inputLength, offset);

            if (lastActualMatch.IsUndefined())
                break;
            lastSuccessfulMatch = lastActualMatch;
            if (!noResult)
            {
                if (arrayResult == 0)
                    arrayResult = CreateMatchResult(stackAllocationPointer, scriptContext, isGlobal, pattern->NumGroups(), input);
                JavascriptString *const matchedString = SubString::New(input, lastActualMatch.offset, lastActualMatch.length);
                if (isGlobal)
                    arrayResult->DirectSetItemAt(globalIndex, matchedString);
                else
                {
                    // The array's head segment up to length - 1 may not be filled. Write to the head segment element directly
                    // instead of calling a helper that expects the segment to be pre-filled.
                    Assert(globalIndex < arrayResult->GetHead()->length);
                    static_cast<SparseArraySegment<Var> *>(arrayResult->GetHead())->elements[globalIndex] = matchedString;
                }
                globalIndex++;
            }
            offset = lastActualMatch.offset + max(lastActualMatch.length, static_cast<CharCountOrFlag>(1));
        } while (isGlobal);
        PrimEndMatch(state, scriptContext, pattern);
        if (updateHistory)
        {
            PropagateLastMatch(scriptContext, isGlobal, isSticky, regularExpression, input, lastSuccessfulMatch, lastActualMatch, true, true);
        }

        if (arrayResult == 0)
        {
            return scriptContext->GetLibrary()->GetNull();
        }

        const int numGroups = pattern->NumGroups();
        if (!isGlobal)
        {
            if (numGroups > 1)
            {
                // Overall match already captured in index 0 by above, so just grab the groups
                Var nonMatchValue = NonMatchValue(scriptContext, false);
                Field(Var) *elements = ((SparseArraySegment<Var>*)arrayResult->GetHead())->elements;
                for (uint groupId = 1; groupId < (uint)numGroups; groupId++)
                {
                    Assert(groupId < arrayResult->GetHead()->left + arrayResult->GetHead()->length);
                    elements[groupId] = GetGroup(scriptContext, pattern, input, nonMatchValue, groupId);
                }
            }
            FinalizeMatchResult(scriptContext, /* isGlobal */ false, arrayResult, lastSuccessfulMatch);
        }
        else
        {
            FinalizeMatchResult(scriptContext, /* isGlobal */ true, arrayResult, lastSuccessfulMatch);
        }

        return arrayResult;
    }